

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O2

bool absl::lts_20240722::debugging_internal::ParseNumber(State *state,int *number_out)

{
  int iVar1;
  bool bVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  
  iVar1 = state->recursion_depth;
  iVar4 = state->steps;
  state->recursion_depth = iVar1 + 1;
  state->steps = iVar4 + 1;
  iVar5 = 0;
  if (iVar4 < 0x20000 && iVar1 < 0x100) {
    bVar2 = ParseOneCharToken(state,'n');
    iVar1 = (state->parse_state).mangled_idx;
    lVar3 = 0;
    while ((byte)(state->mangled_begin[lVar3 + iVar1] - 0x30U) < 10) {
      iVar5 = iVar5 * 10 + (uint)(byte)state->mangled_begin[lVar3 + iVar1] + -0x30;
      lVar3 = lVar3 + 1;
    }
    iVar4 = -iVar5;
    if (!bVar2) {
      iVar4 = iVar5;
    }
    if (lVar3 == 0) {
      iVar5 = 0;
    }
    else {
      (state->parse_state).mangled_idx = iVar1 + (int)lVar3;
      iVar5 = 1;
      if (number_out != (int *)0x0) {
        *number_out = iVar4;
      }
    }
  }
  state->recursion_depth = state->recursion_depth + -1;
  return SUB41(iVar5,0);
}

Assistant:

static bool ParseNumber(State *state, int *number_out) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  bool negative = false;
  if (ParseOneCharToken(state, 'n')) {
    negative = true;
  }
  const char *p = RemainingInput(state);
  uint64_t number = 0;
  for (; *p != '\0'; ++p) {
    if (IsDigit(*p)) {
      number = number * 10 + static_cast<uint64_t>(*p - '0');
    } else {
      break;
    }
  }
  // Apply the sign with uint64_t arithmetic so overflows aren't UB.  Gives
  // "incorrect" results for out-of-range inputs, but negative values only
  // appear for literals, which aren't printed.
  if (negative) {
    number = ~number + 1;
  }
  if (p != RemainingInput(state)) {  // Conversion succeeded.
    state->parse_state.mangled_idx += p - RemainingInput(state);
    UpdateHighWaterMark(state);
    if (number_out != nullptr) {
      // Note: possibly truncate "number".
      *number_out = static_cast<int>(number);
    }
    return true;
  }
  return false;
}